

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loc_comp_ellbvp.h
# Opt level: O0

void __thiscall
lf::uscalfe::
ReactionDiffusionElementMatrixProvider<double,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/test/loc_comp_test.cc:107:7)>,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/test/loc_comp_test.cc:109:48)>_>
::ReactionDiffusionElementMatrixProvider
          (ReactionDiffusionElementMatrixProvider<double,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_uscalfe_test_loc_comp_test_cc:107:7)>,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_uscalfe_test_loc_comp_test_cc:109:48)>_>
           *this,shared_ptr<const_lf::uscalfe::UniformScalarFESpace<double>_> *fe_space,
          MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_uscalfe_test_loc_comp_test_cc:107:7)>
          *alpha,MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_uscalfe_test_loc_comp_test_cc:109:48)>
                 *gamma,quad_rule_collection_t *qr_collection)

{
  bool bVar1;
  RefElType RVar2;
  RefElType RVar3;
  uint uVar4;
  element_type *this_00;
  ScalarReferenceFiniteElement<double> *fe_00;
  pointer ppVar5;
  ostream *poVar6;
  reference this_01;
  QuadRule local_3e8;
  PrecomputedScalarReferenceFiniteElement<double> local_3b8;
  allocator<char> local_341;
  string local_340;
  allocator<char> local_319;
  string local_318;
  allocator<char> local_2f1;
  string local_2f0;
  string local_2d0;
  allocator<char> local_2a9;
  string local_2a8;
  allocator<char> local_281;
  string local_280;
  RefEl local_259;
  stringstream local_258 [8];
  stringstream ss;
  ostream local_248 [383];
  RefEl local_c9;
  undefined1 local_c8 [8];
  QuadRule qr;
  _Self local_90;
  iterator qr_coll_ptr;
  ScalarReferenceFiniteElement<double> *fe;
  const_iterator pRStack_70;
  RefEl ref_el;
  const_iterator __end2;
  const_iterator __begin2;
  initializer_list<lf::base::RefEl> local_58;
  initializer_list<lf::base::RefEl> *local_48;
  initializer_list<lf::base::RefEl> *__range2;
  quad_rule_collection_t *local_30;
  quad_rule_collection_t *qr_collection_local;
  MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_uscalfe_test_loc_comp_test_cc:109:48)>
  *gamma_local;
  MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_uscalfe_test_loc_comp_test_cc:107:7)>
  *alpha_local;
  shared_ptr<const_lf::uscalfe::UniformScalarFESpace<double>_> *fe_space_local;
  ReactionDiffusionElementMatrixProvider<double,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_uscalfe_test_loc_comp_test_cc:107:7)>,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_uscalfe_test_loc_comp_test_cc:109:48)>_>
  *this_local;
  
  this->_vptr_ReactionDiffusionElementMatrixProvider = (_func_int **)&PTR_isActive_00bdf2b0;
  local_30 = qr_collection;
  qr_collection_local = (quad_rule_collection_t *)gamma;
  gamma_local = (MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_uscalfe_test_loc_comp_test_cc:109:48)>
                 *)alpha;
  alpha_local = (MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_uscalfe_test_loc_comp_test_cc:107:7)>
                 *)fe_space;
  fe_space_local = (shared_ptr<const_lf::uscalfe::UniformScalarFESpace<double>_> *)this;
  lf::mesh::utils::
  MeshFunctionGlobal<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/test/loc_comp_test.cc:107:7)>
  ::MeshFunctionGlobal(&this->alpha_,alpha);
  lf::mesh::utils::
  MeshFunctionGlobal<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/test/loc_comp_test.cc:109:48)>
  ::MeshFunctionGlobal(&this->gamma_,gamma);
  memset(&this->fe_precomp_,0,0x230);
  std::array<lf::uscalfe::PrecomputedScalarReferenceFiniteElement<double>,_5UL>::array
            (&this->fe_precomp_);
  __begin2._6_1_ = lf::base::RefEl::kTria();
  __begin2._7_1_ = lf::base::RefEl::kQuad();
  local_58._M_array = (iterator)((long)&__begin2 + 6);
  local_58._M_len = 2;
  local_48 = &local_58;
  __end2 = std::initializer_list<lf::base::RefEl>::begin(local_48);
  pRStack_70 = std::initializer_list<lf::base::RefEl>::end(local_48);
  do {
    if (__end2 == pRStack_70) {
      return;
    }
    fe._7_1_ = (RefEl)__end2->type_;
    this_00 = std::
              __shared_ptr_access<const_lf::uscalfe::UniformScalarFESpace<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<const_lf::uscalfe::UniformScalarFESpace<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)fe_space);
    qr_coll_ptr._M_node._7_1_ = fe._7_1_;
    fe_00 = UniformScalarFESpace<double>::ShapeFunctionLayout(this_00,fe._7_1_);
    if (fe_00 != (ScalarReferenceFiniteElement<double> *)0x0) {
      local_90._M_node =
           (_Base_ptr)
           std::
           map<lf::base::RefEl,_lf::quad::QuadRule,_std::less<lf::base::RefEl>,_std::allocator<std::pair<const_lf::base::RefEl,_lf::quad::QuadRule>_>_>
           ::find(qr_collection,(key_type *)((long)&fe + 7));
      qr.weights_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
           (Index)std::
                  map<lf::base::RefEl,_lf::quad::QuadRule,_std::less<lf::base::RefEl>,_std::allocator<std::pair<const_lf::base::RefEl,_lf::quad::QuadRule>_>_>
                  ::end(qr_collection);
      bVar1 = std::operator==(&local_90,
                              (_Self *)&qr.weights_.
                                        super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                        .m_storage.m_rows);
      if (((bVar1 ^ 0xffU) & 1) != 0) {
        ppVar5 = std::_Rb_tree_iterator<std::pair<const_lf::base::RefEl,_lf::quad::QuadRule>_>::
                 operator->(&local_90);
        quad::QuadRule::QuadRule((QuadRule *)local_c8,&ppVar5->second);
        local_c9 = quad::QuadRule::RefEl((QuadRule *)local_c8);
        RVar2 = lf::base::RefEl::operator_cast_to_RefElType(&local_c9);
        RVar3 = lf::base::RefEl::operator_cast_to_RefElType((RefEl *)((long)&fe + 7));
        if (RVar2 != RVar3) {
          std::__cxx11::stringstream::stringstream(local_258);
          poVar6 = std::operator<<(local_248,"qr.RefEl() = ");
          local_259 = quad::QuadRule::RefEl((QuadRule *)local_c8);
          poVar6 = lf::base::operator<<(poVar6,&local_259);
          poVar6 = std::operator<<(poVar6," <-> ");
          lf::base::operator<<(poVar6,(RefEl *)((long)&fe + 7));
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_280,"qr.RefEl() == ref_el",&local_281);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_2a8,
                     "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/loc_comp_ellbvp.h"
                     ,&local_2a9);
          std::__cxx11::stringstream::str();
          lf::base::AssertionFailed(&local_280,&local_2a8,0x100,&local_2d0);
          std::__cxx11::string::~string((string *)&local_2d0);
          std::__cxx11::string::~string((string *)&local_2a8);
          std::allocator<char>::~allocator(&local_2a9);
          std::__cxx11::string::~string((string *)&local_280);
          std::allocator<char>::~allocator(&local_281);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_2f0,"false",&local_2f1);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_318,
                     "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/loc_comp_ellbvp.h"
                     ,&local_319);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_340,"",&local_341);
          lf::base::AssertionFailed(&local_2f0,&local_318,0x100,&local_340);
          std::__cxx11::string::~string((string *)&local_340);
          std::allocator<char>::~allocator(&local_341);
          std::__cxx11::string::~string((string *)&local_318);
          std::allocator<char>::~allocator(&local_319);
          std::__cxx11::string::~string((string *)&local_2f0);
          std::allocator<char>::~allocator(&local_2f1);
          abort();
        }
        quad::QuadRule::QuadRule(&local_3e8,(QuadRule *)local_c8);
        PrecomputedScalarReferenceFiniteElement<double>::PrecomputedScalarReferenceFiniteElement
                  (&local_3b8,fe_00,&local_3e8);
        uVar4 = lf::base::RefEl::Id((RefEl *)((long)&fe + 7));
        this_01 = std::array<lf::uscalfe::PrecomputedScalarReferenceFiniteElement<double>,_5UL>::
                  operator[](&this->fe_precomp_,(ulong)uVar4);
        PrecomputedScalarReferenceFiniteElement<double>::operator=(this_01,&local_3b8);
        PrecomputedScalarReferenceFiniteElement<double>::~PrecomputedScalarReferenceFiniteElement
                  (&local_3b8);
        quad::QuadRule::~QuadRule(&local_3e8);
        quad::QuadRule::~QuadRule((QuadRule *)local_c8);
      }
    }
    __end2 = __end2 + 1;
  } while( true );
}

Assistant:

ReactionDiffusionElementMatrixProvider<SCALAR, DIFF_COEFF, REACTION_COEFF>::
    ReactionDiffusionElementMatrixProvider(
        std::shared_ptr<const UniformScalarFESpace<SCALAR>> fe_space,
        DIFF_COEFF alpha, REACTION_COEFF gamma,
        quad_rule_collection_t qr_collection)
    : alpha_(std::move(alpha)), gamma_(std::move(gamma)), fe_precomp_() {
  for (auto ref_el : {base::RefEl::kTria(), base::RefEl::kQuad()}) {
    // Obtain pointer to an object describing local shape functions
    auto fe = fe_space->ShapeFunctionLayout(ref_el);
    // Check whether shape functions for that entity type are available
    // Note that the corresponding PrecomputedScalarReferenceFiniteElement local
    // object is not initialized if the associated description of local shape
    // functions is missing.
    if (fe != nullptr) {
      // Obtain quadrature rule from user-supplied collection.
      auto qr_coll_ptr = qr_collection.find(ref_el);
      if (qr_coll_ptr != qr_collection.end()) {
        // A quadrature rule for the current entity type is available
        lf::quad::QuadRule qr = qr_coll_ptr->second;
        LF_ASSERT_MSG(qr.RefEl() == ref_el,
                      "qr.RefEl() = " << qr.RefEl() << " <-> " << ref_el);
        // Precomputations of cell-independent quantities
        fe_precomp_[ref_el.Id()] =
            PrecomputedScalarReferenceFiniteElement(fe, qr);
      }
    }
  }
}